

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_unmodifiedOutputParameterSucceeds_Test::testBody
          (TEST_MockParameterTest_unmodifiedOutputParameterSucceeds_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UtestShell *pUVar3;
  char *pcVar4;
  char *pcVar5;
  TestTerminator *pTVar6;
  SimpleString local_b8;
  SimpleString local_a8;
  SimpleString local_98;
  SimpleString local_88;
  SimpleString local_78;
  SimpleString local_68;
  SimpleString local_58;
  SimpleString local_48 [2];
  SimpleString local_28;
  int local_14;
  TEST_MockParameterTest_unmodifiedOutputParameterSucceeds_Test *pTStack_10;
  int param;
  TEST_MockParameterTest_unmodifiedOutputParameterSucceeds_Test *this_local;
  
  local_14 = 1;
  pTStack_10 = this;
  SimpleString::SimpleString(&local_28,"");
  pMVar2 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_48,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,local_48);
  SimpleString::SimpleString(&local_58,"parameterName");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x40))
            ((long *)CONCAT44(extraout_var,iVar1),&local_58);
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(local_48);
  SimpleString::~SimpleString(&local_28);
  SimpleString::SimpleString(&local_68,"");
  pMVar2 = mock(&local_68,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_78,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_78);
  SimpleString::SimpleString(&local_88,"parameterName");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x28))
            ((long *)CONCAT44(extraout_var_00,iVar1),&local_88,&local_14);
  SimpleString::~SimpleString(&local_88);
  SimpleString::~SimpleString(&local_78);
  SimpleString::~SimpleString(&local_68);
  if (local_14 == 1) {
    pUVar3 = UtestShell::getCurrent();
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
               ,0x285,pTVar6);
  }
  else {
    pUVar3 = UtestShell::getCurrent();
    ::StringFrom((int)&local_98);
    pcVar4 = SimpleString::asCharString(&local_98);
    ::StringFrom((int)&local_a8);
    pcVar5 = SimpleString::asCharString(&local_a8);
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
               ,0x285,pTVar6);
    SimpleString::~SimpleString(&local_a8);
    SimpleString::~SimpleString(&local_98);
  }
  SimpleString::SimpleString(&local_b8,"");
  pMVar2 = mock(&local_b8,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_b8);
  return;
}

Assistant:

TEST(MockParameterTest, unmodifiedOutputParameterSucceeds)
{
    int param = 1;

    mock().expectOneCall("function").withUnmodifiedOutputParameter("parameterName");
    mock().actualCall("function").withOutputParameter("parameterName", &param);

    CHECK_EQUAL(param, 1);
    mock().checkExpectations();
}